

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::SetInnerScopeFromIndex
          (InterpreterStackFrame *this,uint32 index,Var scope)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  
  uVar3 = FunctionBody::GetCountField(*(FunctionBody **)(this + 0x88),InnerScopeCount);
  if (index < uVar3) {
    if (*(long *)(this + 0x68) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x42a,"(this->innerScopeArray != nullptr)",
                                  "this->innerScopeArray != nullptr");
      if (!bVar2) goto LAB_009857c7;
      *puVar4 = 0;
    }
    *(Var *)(*(long *)(this + 0x68) + (ulong)index * 8) = scope;
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x427,"(false)","Illegal byte code: bad inner scope index");
  if (bVar2) {
    *puVar4 = 0;
    Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_009857c7:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void InterpreterStackFrame::SetInnerScopeFromIndex(uint32 index, Var scope)
    {
        if (index >= m_functionBody->GetInnerScopeCount())
        {
            AssertMsg(false, "Illegal byte code: bad inner scope index");
            Js::Throw::FatalInternalError();
        }
        Assert(this->innerScopeArray != nullptr);
        this->innerScopeArray[index] = scope;
    }